

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O0

int Extra_bddNodePathsUnderCutArray
              (DdManager *dd,DdNode **paNodes,DdNode **pbCubes,int nNodes,DdNode **paNodesRes,
              DdNode **pbCubesRes,int CutLevel)

{
  int iVar1;
  st__compare_func_type local_88;
  DdNode *bSum;
  DdNode *aNode_1;
  st__generator *gen_1;
  traventry *p;
  DdNode *aNode;
  st__generator *gen;
  int Counter;
  int i;
  st__table *CutNodes;
  st__table *Visited;
  DdNode **pbCubesRes_local;
  DdNode **paNodesRes_local;
  DdNode **ppDStack_28;
  int nNodes_local;
  DdNode **pbCubes_local;
  DdNode **paNodes_local;
  DdManager *dd_local;
  
  s_CutLevel = CutLevel;
  Visited = (st__table *)pbCubesRes;
  pbCubesRes_local = paNodesRes;
  paNodesRes_local._4_4_ = nNodes;
  ppDStack_28 = pbCubes;
  pbCubes_local = paNodes;
  paNodes_local = (DdNode **)dd;
  if (0 < nNodes) {
    if ((nNodes == 1) && (*(int *)((ulong)*paNodes & 0xfffffffffffffffe) == 0x7fffffff)) {
      if (*paNodes == dd->one) {
        *paNodesRes = dd->one;
        Cudd_Ref(dd->one);
        Visited->compare = (st__compare_func_type)*ppDStack_28;
        Cudd_Ref(*ppDStack_28);
      }
      else {
        *paNodesRes = dd->zero;
        Cudd_Ref(dd->zero);
        Visited->compare = (st__compare_func_type)*ppDStack_28;
        Cudd_Ref(*ppDStack_28);
      }
      dd_local._4_4_ = 1;
    }
    else {
      _Counter = st__init_table(st__ptrcmp,st__ptrhash);
      CutNodes = st__init_table(st__ptrcmp,st__ptrhash);
      for (gen._4_4_ = 0; gen._4_4_ < paNodesRes_local._4_4_; gen._4_4_ = gen._4_4_ + 1) {
        CountNodeVisits_rec((DdManager *)paNodes_local,pbCubes_local[gen._4_4_],CutNodes);
      }
      for (gen._4_4_ = 0; gen._4_4_ < paNodesRes_local._4_4_; gen._4_4_ = gen._4_4_ + 1) {
        CollectNodesAndComputePaths_rec
                  ((DdManager *)paNodes_local,pbCubes_local[gen._4_4_],ppDStack_28[gen._4_4_],
                   CutNodes,_Counter);
      }
      aNode = (DdNode *)st__init_gen(CutNodes);
      while (iVar1 = st__gen((st__generator *)aNode,(char **)&p,(char **)&gen_1), iVar1 != 0) {
        Cudd_RecursiveDeref((DdManager *)paNodes_local,(DdNode *)gen_1->entry);
        if (gen_1 != (st__generator *)0x0) {
          free(gen_1);
          gen_1 = (st__generator *)0x0;
        }
      }
      st__free_gen((st__generator *)aNode);
      st__free_table(CutNodes);
      gen._0_4_ = 0;
      aNode_1 = (DdNode *)st__init_gen(_Counter);
      while (iVar1 = st__gen((st__generator *)aNode_1,(char **)&bSum,(char **)&local_88), iVar1 != 0
            ) {
        pbCubesRes_local[(int)gen] = bSum;
        Cudd_Ref(bSum);
        (&Visited->compare)[(int)gen] = local_88;
        gen._0_4_ = (int)gen + 1;
      }
      st__free_gen((st__generator *)aNode_1);
      st__free_table(_Counter);
      dd_local._4_4_ = (int)gen;
    }
    return dd_local._4_4_;
  }
  __assert_fail("nNodes > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddCas.c"
                ,0x16c,
                "int Extra_bddNodePathsUnderCutArray(DdManager *, DdNode **, DdNode **, int, DdNode **, DdNode **, int)"
               );
}

Assistant:

int Extra_bddNodePathsUnderCutArray( DdManager * dd, DdNode ** paNodes, DdNode ** pbCubes, int nNodes, DdNode ** paNodesRes, DdNode ** pbCubesRes, int CutLevel )
{
    st__table * Visited;  // temporary table to remember the visited nodes
    st__table * CutNodes; // the nodes under the cut go here
    int i, Counter;

    s_CutLevel = CutLevel;

    // there should be some nodes
    assert( nNodes > 0 );
    if ( nNodes == 1 && Cudd_IsConstant( paNodes[0] ) )
    {
        if ( paNodes[0] == a1 )
        {
            paNodesRes[0] = a1;          Cudd_Ref( a1 );
            pbCubesRes[0] = pbCubes[0];  Cudd_Ref( pbCubes[0] );
        }
        else
        {
            paNodesRes[0] = a0;          Cudd_Ref( a0 );
            pbCubesRes[0] = pbCubes[0];  Cudd_Ref( pbCubes[0] );
        }
        return 1;
    }

    // Step 1: Start the table and collect information about the nodes above the cut 
    // this information tells how many edges point to each node
    CutNodes = st__init_table( st__ptrcmp, st__ptrhash);;
    Visited  = st__init_table( st__ptrcmp, st__ptrhash);;

    for ( i = 0; i < nNodes; i++ )
        CountNodeVisits_rec( dd, paNodes[i], Visited );

    // Step 2: Traverse the BDD using the visited table and compute the sum of paths
    for ( i = 0; i < nNodes; i++ )
        CollectNodesAndComputePaths_rec( dd, paNodes[i], pbCubes[i], Visited, CutNodes );

    // at this point, the table of cut nodes is ready and the table of visited is useless
    {
        st__generator * gen;
        DdNode * aNode;
        traventry * p;
        st__foreach_item( Visited, gen, (const char**)&aNode, (char**)&p )
        {
            Cudd_RecursiveDeref( dd, p->bSum );
            ABC_FREE( p );
        }
        st__free_table( Visited );
    }

    // go through the table CutNodes and create the BDD and the path to be returned
    {
        st__generator * gen;
        DdNode * aNode, * bSum;
        Counter = 0;
        st__foreach_item( CutNodes, gen, (const char**)&aNode, (char**)&bSum)
        {
            paNodesRes[Counter] = aNode;   Cudd_Ref( aNode ); 
            pbCubesRes[Counter] = bSum;
            Counter++;
        }
        st__free_table( CutNodes );
    }

    // return the number of cofactors found
    return Counter;

}